

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<12,_11,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  Matrix<float,_2,_4> *extraout_RDX;
  Matrix<float,_2,_4> *extraout_RDX_00;
  Matrix<float,_2,_4> *mat;
  Matrix<float,_2,_4> *mat_00;
  Type in0;
  Mat4x2 MStack_c8;
  Vector<float,_3> local_a8;
  Vector<float,_3> local_98;
  tcu local_8c [12];
  VecAccess<float,_4,_3> local_80;
  Matrix<float,_2,_4> local_68;
  Matrix<float,_2,_4> local_48;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,11>(&MStack_c8,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
    mat = extraout_RDX;
  }
  else {
    tcu::Matrix<float,_2,_4>::Matrix(&MStack_c8,(float *)s_constInMat4x2);
    mat = extraout_RDX_00;
  }
  decrement<float,2,4>(&local_48,(MatrixCaseUtils *)&MStack_c8,mat);
  local_98.m_data[2] = local_48.m_data.m_data[2].m_data[0] + local_48.m_data.m_data[2].m_data[1];
  local_98.m_data[0] =
       local_48.m_data.m_data[3].m_data[0] +
       local_48.m_data.m_data[0].m_data[0] + local_48.m_data.m_data[0].m_data[1];
  local_98.m_data[1] =
       local_48.m_data.m_data[3].m_data[1] +
       local_48.m_data.m_data[1].m_data[1] + local_48.m_data.m_data[1].m_data[0];
  decrement<float,2,4>(&local_68,(MatrixCaseUtils *)&MStack_c8,mat_00);
  local_a8.m_data[2] = local_68.m_data.m_data[2].m_data[0] + local_68.m_data.m_data[2].m_data[1];
  local_a8.m_data[0] =
       local_68.m_data.m_data[3].m_data[0] +
       local_68.m_data.m_data[0].m_data[0] + local_68.m_data.m_data[0].m_data[1];
  local_a8.m_data[1] =
       local_68.m_data.m_data[3].m_data[1] +
       local_68.m_data.m_data[1].m_data[1] + local_68.m_data.m_data[1].m_data[0];
  tcu::operator+(local_8c,&local_98,&local_a8);
  local_80.m_vector = &evalCtx->color;
  local_80.m_index[0] = 0;
  local_80.m_index[1] = 1;
  local_80.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_80,(Vector<float,_3> *)local_8c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(in0)) + reduceToVec3(decrement(in0));
	}